

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# junit_log_formatter.hpp
# Opt level: O2

junit_log_helper * __thiscall
boost::unit_test::output::junit_log_formatter::get_current_log_entry(junit_log_formatter *this)

{
  iterator iVar1;
  
  if (((this->list_path_to_root).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&this->list_path_to_root)
     && (iVar1 = std::
                 _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_boost::unit_test::output::junit_impl::junit_log_helper>,_std::_Select1st<std::pair<const_unsigned_long,_boost::unit_test::output::junit_impl::junit_log_helper>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_boost::unit_test::output::junit_impl::junit_log_helper>_>_>
                 ::find(&(this->map_tests)._M_t,
                        (key_type *)
                        ((this->list_path_to_root).
                         super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         _M_node.super__List_node_base._M_prev + 1)),
        (_Rb_tree_header *)iVar1._M_node != &(this->map_tests)._M_t._M_impl.super__Rb_tree_header))
  {
    return (junit_log_helper *)&iVar1._M_node[1]._M_parent;
  }
  return &this->runner_log_entry;
}

Assistant:

junit_impl::junit_log_helper& get_current_log_entry() {
        if(list_path_to_root.empty())
            return runner_log_entry;
        map_trace_t::iterator it = map_tests.find(list_path_to_root.back());
        return (it == map_tests.end() ? runner_log_entry : it->second);
    }